

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_mnist.cpp
# Opt level: O1

int main(void)

{
  long *plVar1;
  undefined1 *puVar2;
  char cVar3;
  MakeNet *pMVar4;
  ostream *poVar5;
  __off_t __length;
  ulong uVar6;
  pointer *__ptr;
  long lVar7;
  unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  rng;
  IntClassifier metrics;
  Net net;
  LabeledDataset mnist;
  LabeledDataset mnistMiniTest;
  LabeledDataset mnistTest;
  OneHotEncoder onehot;
  ofstream nnfile;
  _Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
  local_488;
  IterationCallback local_480;
  PlainTextNetworkWriter local_458;
  undefined **local_450;
  OneHotEncoder *local_448;
  MakeNet *local_440;
  undefined1 local_438 [16];
  pointer local_428;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  code *local_408;
  pointer pLStack_400;
  code *local_3f8;
  code *pcStack_3f0;
  string local_3e0;
  string local_3c0;
  LabeledDataset local_3a0;
  vector<int,_std::allocator<int>_> local_358;
  string local_340;
  LabeledDataset local_320;
  LabeledDataset local_2d8;
  OneHotEncoder local_290;
  undefined1 local_230 [8];
  undefined1 local_228 [16];
  pointer pMStack_218;
  pointer pMStack_210;
  pointer pLStack_208;
  pointer local_200;
  pointer pLStack_1f8;
  bool local_1f0;
  ios_base local_138 [264];
  
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_340,LABELS_FILE_abi_cxx11_._M_dataplus._M_p,
             LABELS_FILE_abi_cxx11_._M_dataplus._M_p + LABELS_FILE_abi_cxx11_._M_string_length);
  readMNIST(&local_3a0,&IMAGES_FILE_abi_cxx11_,&local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c0,LABELS_TEST_FILE_abi_cxx11_._M_dataplus._M_p,
             LABELS_TEST_FILE_abi_cxx11_._M_dataplus._M_p +
             LABELS_TEST_FILE_abi_cxx11_._M_string_length);
  readMNIST(&local_2d8,&IMAGES_TEST_FILE_abi_cxx11_,&local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e0,LABELS_TEST_FILE_abi_cxx11_._M_dataplus._M_p,
             LABELS_TEST_FILE_abi_cxx11_._M_dataplus._M_p +
             LABELS_TEST_FILE_abi_cxx11_._M_string_length);
  readMNIST(&local_320,&IMAGES_TEST_FILE_abi_cxx11_,&local_3e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p);
  }
  local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  notch::pre::OneHotEncoder::OneHotEncoder(&local_290,&local_3a0.outputs,&local_358);
  if (local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  notch::core::LabeledDataset::applyToLabels(&local_3a0,&local_290.super_ADatasetTransformer);
  notch::core::LabeledDataset::applyToLabels(&local_2d8,&local_290.super_ADatasetTransformer);
  notch::core::LabeledDataset::applyToLabels(&local_320,&local_290.super_ADatasetTransformer);
  notch::core::Init::newRNG();
  notch::core::LabeledDataset::shuffle
            (&local_320,
             (unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
              *)&local_488);
  notch::core::LabeledDataset::truncate(&local_320,(char *)0x3e8,__length);
  local_230 = (undefined1  [8])local_3a0.inputDimension;
  local_228._0_8_ = local_3a0.inputDimension;
  local_228._8_8_ = (pointer)0x0;
  pMStack_218 = (pointer)0x0;
  pMStack_210 = (pointer)0x0;
  pLStack_208 = (pointer)0x0;
  local_200 = (pointer)0x0;
  pLStack_1f8 = (pointer)0x0;
  local_1f0 = false;
  pMVar4 = notch::core::MakeNet::addFC
                     ((MakeNet *)local_230,300,(Activation *)notch::core::scaledTanh);
  pMVar4 = notch::core::MakeNet::addFC(pMVar4,100,(Activation *)notch::core::leakyReLU);
  pMVar4 = notch::core::MakeNet::addFC
                     (pMVar4,local_3a0.outputDimension,(Activation *)notch::core::scaledTanh);
  pMVar4 = notch::core::MakeNet::addLoss(pMVar4,Softmax);
  pLStack_400 = (pointer)0x0;
  local_408 = notch::core::Init::normalXavier;
  pcStack_3f0 = notch::core::std::
                _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
                ::_M_invoke;
  local_3f8 = notch::core::std::
              _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
              ::_M_manager;
  notch::core::MakeNet::init((MakeNet *)local_438,(EVP_PKEY_CTX *)pMVar4);
  if (local_3f8 != (code *)0x0) {
    (*local_3f8)(&local_408,&local_408,3);
  }
  if (pLStack_208 != (pointer)0x0) {
    operator_delete(pLStack_208);
  }
  notch::core::std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::~vector
            ((vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_> *)
             (local_228 + 8));
  local_450 = &PTR_aslabel_00127be8;
  local_230 = (undefined1  [8])&PTR_update_00127c38;
  local_228._0_8_ = (void *)0x358637bd3f733333;
  local_228._8_8_ = (pointer)0x0;
  pMStack_218 = (pointer)0x0;
  local_448 = &local_290;
  local_440 = (MakeNet *)local_438;
  if (local_428 != (pointer)local_438._8_8_) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      plVar1 = *(long **)((long)(size_t *)local_438._8_8_ + lVar7);
      (**(code **)(*plVar1 + 0x70))(plVar1,local_230);
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < (ulong)((long)local_428 - local_438._8_8_ >> 4));
  }
  local_230._0_4_ = 1;
  local_228._0_8_ = (void *)0x0;
  local_228._8_8_ = (pointer)0x0;
  pMStack_218 = (pointer)0x0;
  pMStack_210 = (pointer)0x0;
  local_228._0_8_ = operator_new(0x18);
  *(MakeNet **)local_228._0_8_ = (MakeNet *)local_438;
  *(LabeledDataset **)(local_228._0_8_ + 8) = &local_2d8;
  *(undefined ****)(local_228._0_8_ + 0x10) = &local_450;
  pMStack_210 = (pointer)notch::core::std::
                         _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_mnist.cpp:126:35)>
                         ::_M_invoke;
  pMStack_218 = (pointer)notch::core::std::
                         _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_mnist.cpp:126:35)>
                         ::_M_manager;
  local_480.period = 1000;
  local_480.callback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_480.callback.super__Function_base._M_functor._8_8_ = 0;
  local_480.callback.super__Function_base._M_manager = (_Manager_type)0x0;
  local_480.callback._M_invoker = (_Invoker_type)0x0;
  local_480.callback.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
  *(MakeNet **)local_480.callback.super__Function_base._M_functor._M_unused._0_8_ =
       (MakeNet *)local_438;
  *(LabeledDataset **)((long)local_480.callback.super__Function_base._M_functor._M_unused._0_8_ + 8)
       = &local_320;
  *(undefined ****)((long)local_480.callback.super__Function_base._M_functor._M_unused._0_8_ + 0x10)
       = &local_450;
  local_480.callback._M_invoker =
       notch::core::std::
       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_mnist.cpp:131:42)>
       ::_M_invoke;
  local_480.callback.super__Function_base._M_manager =
       notch::core::std::
       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_mnist.cpp:131:42)>
       ::_M_manager;
  notch::core::SGD::train((Net *)local_438,&local_3a0,3,(EpochCallback *)local_230,&local_480);
  if (local_480.callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_480.callback.super__Function_base._M_manager)
              ((_Any_data *)&local_480.callback,(_Any_data *)&local_480.callback,__destroy_functor);
  }
  if (pMStack_218 != (pointer)0x0) {
    (*(code *)pMStack_218)(local_228,local_228,3);
  }
  std::ofstream::ofstream((ostream *)local_230,(string *)&SAVE_NETWORK_SNAPSHOT_abi_cxx11_,_S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    local_458.out = (ostream *)local_230;
    notch::io::PlainTextNetworkWriter::save(&local_458,(Net *)local_438);
    puVar2 = (undefined1 *)
             ((long)local_480.callback.super__Function_base._M_functor._M_pod_data + 8);
    local_480._0_8_ = puVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"\n","");
    std::__ostream_insert<char,std::char_traits<char>>
              (local_458.out,(char *)local_480._0_8_,
               local_480.callback.super__Function_base._M_functor._M_unused._M_member_pointer);
    if ((undefined1 *)local_480._0_8_ != puVar2) {
      operator_delete((void *)local_480._0_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wrote ",6);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,SAVE_NETWORK_SNAPSHOT_abi_cxx11_._M_dataplus._M_p,
                        SAVE_NETWORK_SNAPSHOT_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT - 0x18)) = _memcpy;
  std::filebuf::~filebuf((filebuf *)local_228);
  std::ios_base::~ios_base(local_138);
  local_438._0_8_ = &PTR_append_00127560;
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    notch::core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_410._M_pi);
  }
  notch::core::std::
  vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ::~vector((vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
             *)(local_438 + 8));
  if (local_488._M_head_impl !=
      (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
       *)0x0) {
    operator_delete(local_488._M_head_impl);
  }
  local_290.super_ADatasetTransformer._vptr_ADatasetTransformer = (_func_int **)&PTR_apply_00127508;
  notch::core::std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_290.columnValues._M_t);
  if (local_290.inputColumns.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_290.inputColumns.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_320.outputs);
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_320.inputs);
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_2d8.outputs);
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_2d8.inputs);
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_3a0.outputs);
  notch::core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            (&local_3a0.inputs);
  return 0;
}

Assistant:

int main() {
    LabeledDataset mnist = readMNIST(IMAGES_FILE, LABELS_FILE);
    LabeledDataset mnistTest = readMNIST(IMAGES_TEST_FILE, LABELS_TEST_FILE);
    LabeledDataset mnistMiniTest = readMNIST(IMAGES_TEST_FILE, LABELS_TEST_FILE);

    OneHotEncoder onehot(mnist.getLabels());
    mnist.applyToLabels(onehot);
    mnistTest.applyToLabels(onehot);
    mnistMiniTest.applyToLabels(onehot);

    // test on a small dataset while running
    unique_ptr<RNG> rng = Init::newRNG();
    mnistMiniTest.shuffle(rng);
    mnistMiniTest.truncate(1000);

    Net net = MakeNet(mnist.inputDim())
        .addFC(300, scaledTanh)
        .addFC(100, leakyReLU)
        .addFC(mnist.outputDim(), scaledTanh)
        .addSoftmax()
        .init();

    IntClassifier metrics(net, onehot);
    net.setLearningPolicy(AdaDelta());
    SGD::train(net, mnist, 3 /* epochs */,
               EpochCallback { 1, [&](int i) {
                   cout << "epoch " << i << ": ";
                   printStats(net, mnistTest, metrics);
                   return false;
               }},
               IterationCallback { 1000, [&](int i) {
                   cout << "sample " << i << ": ";
                   printStats(net, mnistMiniTest, metrics);
                   return false;
               }});

    ofstream nnfile(SAVE_NETWORK_SNAPSHOT);
    if (nnfile.is_open()) {
        PlainTextNetworkWriter(nnfile) << net << "\n";
        cout << "wrote " << SAVE_NETWORK_SNAPSHOT << "\n";
    }
}